

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# burstsort.cpp
# Opt level: O2

void insert<16000u,vector_bagwell<unsigned_char*,16u>,BurstSimple<unsigned_char>,unsigned_char>
               (TrieNode<unsigned_char> *root,uchar **strings,size_t n)

{
  _WordT *p_Var1;
  byte bVar2;
  vector_bagwell<unsigned_char_*,_16U> *pvVar3;
  size_t sVar4;
  TrieNode<unsigned_char> *pTVar5;
  TrieNode<unsigned_char> *pTVar6;
  size_t depth;
  ulong uVar7;
  BurstSimple<unsigned_char> local_61;
  vector_bagwell<unsigned_char_*,_16U> *local_60;
  uchar *str;
  TrieNode<unsigned_char> *local_50;
  uchar **local_48;
  size_t local_40;
  size_t local_38;
  
  local_38 = 0;
  local_50 = root;
  local_48 = strings;
  local_40 = n;
  do {
    if (local_38 == local_40) {
      return;
    }
    str = local_48[local_38];
    bVar2 = get_char<unsigned_char>(str,0);
    pTVar6 = local_50;
    depth = 1;
    while( true ) {
      uVar7 = (ulong)bVar2;
      if (((pTVar6->is_trie).super__Base_bitset<4UL>._M_w[bVar2 >> 6] >> (uVar7 & 0x3f) & 1) == 0)
      break;
      if (uVar7 == 0) {
        __assert_fail("not is_end(c)",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/burstsort.cpp"
                      ,0xdf,
                      "void insert(TrieNode<CharT> *, unsigned char **, size_t) [Threshold = 16000U, BucketT = vector_bagwell<unsigned char *>, BurstImpl = BurstSimple<unsigned char>, CharT = unsigned char]"
                     );
      }
      pTVar6 = (TrieNode<unsigned_char> *)(pTVar6->buckets)._M_elems[uVar7];
      bVar2 = get_char<unsigned_char>(str,depth);
      depth = depth + 1;
    }
    pvVar3 = (vector_bagwell<unsigned_char_*,_16U> *)(pTVar6->buckets)._M_elems[uVar7];
    if (pvVar3 == (vector_bagwell<unsigned_char_*,_16U> *)0x0) {
      pvVar3 = (vector_bagwell<unsigned_char_*,_16U> *)operator_new(0x28);
      (pvVar3->_index_block).super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (pvVar3->_index_block).super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (pvVar3->_index_block).super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pvVar3->_insertpos = (uchar **)0x0;
      pvVar3->_left_in_block = 0;
      (pTVar6->buckets)._M_elems[uVar7] = pvVar3;
    }
    local_60 = pvVar3;
    vector_bagwell<unsigned_char_*,_16U>::push_back(pvVar3,&str);
    if (uVar7 != 0) {
      sVar4 = vector_bagwell<unsigned_char_*,_16U>::size(local_60);
      if (16000 < sVar4) {
        pTVar5 = BurstSimple<unsigned_char>::operator()(&local_61,local_60,depth);
        pvVar3 = local_60;
        (pTVar6->buckets)._M_elems[uVar7] = pTVar5;
        p_Var1 = (pTVar6->is_trie).super__Base_bitset<4UL>._M_w + (bVar2 >> 6);
        *p_Var1 = *p_Var1 | 1L << (bVar2 & 0x3f);
        vector_bagwell<unsigned_char_*,_16U>::~vector_bagwell(local_60);
        operator_delete(pvVar3);
      }
    }
    local_38 = local_38 + 1;
  } while( true );
}

Assistant:

static inline void
insert(TrieNode<CharT>* root, unsigned char** strings, size_t n)
{
	for (size_t i=0; i < n; ++i) {
		unsigned char* str = strings[i];
		size_t depth = 0;
		CharT c = get_char<CharT>(str, 0);
		TrieNode<CharT>* node = root;
		while (node->is_trie[c]) {
			assert(not is_end(c));
			node = static_cast<TrieNode<CharT>*>(node->buckets[c]);
			depth += sizeof(CharT);
			c = get_char<CharT>(str, depth);
		}
		BucketT* bucket = static_cast<BucketT*>(node->buckets[c]);
		if (not bucket) {
			node->buckets[c] = bucket = new BucketT;
		}
		bucket->push_back(str);
		if (is_end(c)) continue;
		if (bucket->size() > Threshold) {
			node->buckets[c] = BurstImpl()(*bucket,
					depth+sizeof(CharT));
			node->is_trie[c] = true;
			delete bucket;
		}
	}
}